

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::apply_settings_pack_impl
          (session_impl *this,
          vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *pack)

{
  bool bVar1;
  pointer pdVar2;
  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  char *pcVar3;
  bool local_51;
  bool local_41;
  shared_ptr<libtorrent::aux::torrent> *t;
  iterator __end3;
  iterator __begin3;
  torrent_list<libtorrent::aux::torrent> *__range3;
  bool update_want_peers;
  bool reopen_listen_port;
  vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *pack_local;
  session_impl *this_local;
  
  bVar1 = (anonymous_namespace)::setting_changed<std::__cxx11::string>(pack,&this->m_settings,5);
  local_41 = true;
  if (!bVar1) {
    bVar1 = anon_unknown_119::setting_changed<int>(pack,&this->m_settings,0x407b);
    local_41 = true;
    if (!bVar1) {
      local_41 = anon_unknown_119::setting_changed<bool>(pack,&this->m_settings,0x8041);
    }
  }
  bVar1 = anon_unknown_119::setting_changed<bool>(pack,&this->m_settings,0x802a);
  local_51 = true;
  if (!bVar1) {
    bVar1 = anon_unknown_119::setting_changed<bool>(pack,&this->m_settings,0x8022);
    local_51 = true;
    if (!bVar1) {
      local_51 = anon_unknown_119::setting_changed<bool>(pack,&this->m_settings,0x8020);
    }
  }
  pcVar3 = "false";
  if (local_41 != false) {
    pcVar3 = "true";
  }
  session_log(this,"applying settings pack, reopen_listen_port=%s",pcVar3);
  apply_pack((settings_pack *)pack,&this->m_settings,this);
  validate_settings(this);
  pdVar2 = ::std::
           unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>
           ::operator->(&this->m_disk_thread);
  (*pdVar2->_vptr_disk_interface[0x12])();
  if (local_41 == false) {
    update_listen_interfaces(this);
  }
  else {
    reopen_listen_sockets(this,true);
  }
  if (local_51 != false) {
    __end3 = torrent_list<libtorrent::aux::torrent>::begin(&this->m_torrents);
    t = (shared_ptr<libtorrent::aux::torrent> *)
        torrent_list<libtorrent::aux::torrent>::end(&this->m_torrents);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                                       *)&t), bVar1) {
      this_00 = (__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)__gnu_cxx::
                   __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                   ::operator*(&__end3);
      this_01 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(this_00);
      torrent::update_want_peers(this_01);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
      ::operator++(&__end3);
    }
  }
  return;
}

Assistant:

void session_impl::apply_settings_pack_impl(settings_pack const& pack)
	{
		bool const reopen_listen_port
			= setting_changed<std::string>(pack, m_settings, settings_pack::listen_interfaces)
			|| setting_changed<int>(pack, m_settings, settings_pack::proxy_type)
			|| setting_changed<bool>(pack, m_settings, settings_pack::proxy_peer_connections)
#if TORRENT_ABI_VERSION == 1
			|| setting_changed<int>(pack, m_settings, settings_pack::ssl_listen)
#endif
			;

		bool const update_want_peers
			= setting_changed<bool>(pack, m_settings, settings_pack::seeding_outgoing_connections)
			|| setting_changed<bool>(pack, m_settings, settings_pack::enable_outgoing_tcp)
			|| setting_changed<bool>(pack, m_settings, settings_pack::enable_outgoing_utp)
		;

#ifndef TORRENT_DISABLE_LOGGING
		session_log("applying settings pack, reopen_listen_port=%s"
			, reopen_listen_port ? "true" : "false");
#endif

		apply_pack(&pack, m_settings, this);

#if !defined TORRENT_DISABLE_LOGGING || TORRENT_USE_ASSERTS
		validate_settings();
#endif

		m_disk_thread->settings_updated();

		if (!reopen_listen_port)
		{
			// no need to call this if reopen_listen_port is true
			// since the apply_pack will do it
			update_listen_interfaces();
		}
		else
		{
			reopen_listen_sockets();
		}

		if (update_want_peers)
		{
			for (auto const& t : m_torrents)
				t->update_want_peers();
		}
	}